

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

BaseType __thiscall
spirv_cross::CompilerHLSL::get_builtin_basetype
          (CompilerHLSL *this,BuiltIn builtin,BaseType default_type)

{
  BaseType default_type_local;
  BuiltIn builtin_local;
  CompilerHLSL *this_local;
  
  this_local._4_4_ = default_type;
  if (builtin != BuiltInSampleMask) {
    this_local._4_4_ =
         CompilerGLSL::get_builtin_basetype(&this->super_CompilerGLSL,builtin,default_type);
  }
  return this_local._4_4_;
}

Assistant:

SPIRType::BaseType CompilerHLSL::get_builtin_basetype(BuiltIn builtin, SPIRType::BaseType default_type)
{
	switch (builtin)
	{
	case BuiltInSampleMask:
		// We declare sample mask array with module type, so always use default_type here.
		return default_type;
	default:
		return CompilerGLSL::get_builtin_basetype(builtin, default_type);
	}
}